

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O3

void __thiscall Fl_Help_Dialog::cb_view__i(Fl_Help_Dialog *this,Fl_Help_View *param_1,void *param_2)

{
  char *src;
  int iVar1;
  Fl_Help_View *pFVar2;
  char *src_00;
  int iVar3;
  
  pFVar2 = this->view_;
  if (pFVar2->filename_[0] == '\0') {
    this->index_ = 0;
    this->file_[0][0] = '\0';
    this->line_[0] = pFVar2->topline_;
    Fl_Widget::deactivate(&this->back_->super_Fl_Widget);
    Fl_Widget::deactivate(&this->forward_->super_Fl_Widget);
    return;
  }
  src = pFVar2->filename_;
  if (((pFVar2->super_Fl_Group).super_Fl_Widget.flags_ & 0x80) == 0) {
    fl_strlcpy(this->file_[this->index_],src,0x800);
    this->line_[this->index_] = this->view_->topline_;
    return;
  }
  iVar1 = this->index_;
  iVar3 = iVar1 + 1;
  this->index_ = iVar3;
  if (0x62 < iVar1) {
    memmove(this->line_,this->line_ + 10,0x168);
    memmove(this->file_,this->file_ + 10,0x2d000);
    iVar3 = iVar1 + -9;
    this->index_ = iVar3;
  }
  this->max_ = iVar3;
  src_00 = (char *)0x0;
  if (*src != '\0') {
    src_00 = src;
  }
  fl_strlcpy(this->file_[iVar3],src_00,0x800);
  this->line_[this->index_] = this->view_->topline_;
  if (this->index_ < 1) {
    Fl_Widget::deactivate(&this->back_->super_Fl_Widget);
  }
  else {
    Fl_Widget::activate(&this->back_->super_Fl_Widget);
  }
  Fl_Widget::deactivate(&this->forward_->super_Fl_Widget);
  Fl_Window::label(&this->window_->super_Fl_Window,this->view_->title_);
  return;
}

Assistant:

void Fl_Help_Dialog::cb_view__i(Fl_Help_View*, void*) {
  if (view_->filename())
{
  if (view_->changed())
  {
    index_ ++;

    if (index_ >= 100)
    {
      memmove(line_, line_ + 10, sizeof(line_[0]) * 90);
      memmove(file_, file_ + 10, sizeof(file_[0]) * 90);
      index_ -= 10;
    }

    max_ = index_;

    strlcpy(file_[index_], view_->filename(),sizeof(file_[0]));
    line_[index_] = view_->topline();

    if (index_ > 0)
      back_->activate();
    else
      back_->deactivate();

    forward_->deactivate();
    window_->label(view_->title());
  }
  else // if ! view_->changed()
  {
    strlcpy(file_[index_], view_->filename(), sizeof(file_[0]));
    line_[index_] = view_->topline();
  }
} else { // if ! view_->filename()
  index_ = 0; // hitting an internal page will disable the back/fwd buffer
  file_[index_][0] = 0; // unnamed internal page
  line_[index_] = view_->topline();
  back_->deactivate();
  forward_->deactivate();
};
}